

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandSYST(FtpSession *this,string *param_1)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_1_local;
  FtpSession *this_local;
  
  local_18 = param_1;
  param_1_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"UNIX",&local_39);
  sendFtpMessage(this,NAME_SYSTEM_TYPE,(string *)local_38);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void FtpSession::handleFtpCommandSYST(const std::string& /*param*/)
  {
    // Always returning "UNIX" when being asked for the operating system.
    // Some clients (Mozilla Firefox for example) may disconnect, when we
    // return an unknown operating system here. As depending on the Server's
    // operating system is a horrible feature anyways, we simply fake it.
    //
    // Unix should be the best compatible value here, as we emulate Unix-like
    // outputs for other commands (-> LIST) on all operating systems.
    sendFtpMessage(FtpReplyCode::NAME_SYSTEM_TYPE, "UNIX");
  }